

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O3

JSValue js_os_ttySetRaw(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  undefined1 auVar1 [16];
  int iVar2;
  ulong uVar3;
  int fd;
  int local_4c;
  termios local_48;
  
  iVar2 = JS_ToInt32(ctx,&local_4c,*argv);
  uVar3 = 6;
  if (iVar2 == 0) {
    local_48.c_cc[0x1f] = '\0';
    local_48._49_3_ = 0;
    local_48.c_ispeed = 0;
    local_48.c_ospeed = 0;
    local_48.c_cc[0xf] = '\0';
    local_48.c_cc[0x10] = '\0';
    local_48.c_cc[0x11] = '\0';
    local_48.c_cc[0x12] = '\0';
    local_48.c_cc[0x13] = '\0';
    local_48.c_cc[0x14] = '\0';
    local_48.c_cc[0x15] = '\0';
    local_48.c_cc[0x16] = '\0';
    local_48.c_cc[0x17] = '\0';
    local_48.c_cc[0x18] = '\0';
    local_48.c_cc[0x19] = '\0';
    local_48.c_cc[0x1a] = '\0';
    local_48.c_cc[0x1b] = '\0';
    local_48.c_cc[0x1c] = '\0';
    local_48.c_cc[0x1d] = '\0';
    local_48.c_cc[0x1e] = '\0';
    local_48.c_line = '\0';
    local_48.c_cc[0] = '\0';
    local_48.c_cc[1] = '\0';
    local_48.c_cc[2] = '\0';
    local_48.c_cc[3] = '\0';
    local_48.c_cc[4] = '\0';
    local_48.c_cc[5] = '\0';
    local_48.c_cc[6] = '\0';
    local_48.c_cc[7] = '\0';
    local_48.c_cc[8] = '\0';
    local_48.c_cc[9] = '\0';
    local_48.c_cc[10] = '\0';
    local_48.c_cc[0xb] = '\0';
    local_48.c_cc[0xc] = '\0';
    local_48.c_cc[0xd] = '\0';
    local_48.c_cc[0xe] = '\0';
    local_48.c_iflag = 0;
    local_48.c_oflag = 0;
    local_48.c_cflag = 0;
    local_48.c_lflag = 0;
    tcgetattr(local_4c,&local_48);
    oldtty.c_iflag = local_48.c_iflag;
    oldtty.c_oflag = local_48.c_oflag;
    oldtty.c_cflag = local_48.c_cflag;
    oldtty.c_lflag = local_48.c_lflag;
    oldtty.c_line = local_48.c_line;
    oldtty.c_cc[0] = local_48.c_cc[0];
    oldtty.c_cc[1] = local_48.c_cc[1];
    oldtty.c_cc[2] = local_48.c_cc[2];
    oldtty.c_cc[3] = local_48.c_cc[3];
    oldtty.c_cc[4] = local_48.c_cc[4];
    oldtty.c_cc[5] = local_48.c_cc[5];
    oldtty.c_cc[6] = local_48.c_cc[6];
    oldtty.c_cc[7] = local_48.c_cc[7];
    oldtty.c_cc[8] = local_48.c_cc[8];
    oldtty.c_cc[9] = local_48.c_cc[9];
    oldtty.c_cc[10] = local_48.c_cc[10];
    oldtty.c_cc[0xb] = local_48.c_cc[0xb];
    oldtty.c_cc[0xc] = local_48.c_cc[0xc];
    oldtty.c_cc[0xd] = local_48.c_cc[0xd];
    oldtty.c_cc[0xe] = local_48.c_cc[0xe];
    local_48._0_8_ = local_48._0_8_ & 0xfffffffffffffa14;
    local_48._0_8_ = local_48._0_8_ | 0x100000000;
    oldtty.c_cc[0xf] = local_48.c_cc[0xf];
    oldtty.c_cc[0x10] = local_48.c_cc[0x10];
    oldtty.c_cc[0x11] = local_48.c_cc[0x11];
    oldtty.c_cc[0x12] = local_48.c_cc[0x12];
    oldtty.c_cc[0x13] = local_48.c_cc[0x13];
    oldtty.c_cc[0x14] = local_48.c_cc[0x14];
    oldtty.c_cc[0x15] = local_48.c_cc[0x15];
    oldtty.c_cc[0x16] = local_48.c_cc[0x16];
    oldtty.c_cc[0x17] = local_48.c_cc[0x17];
    oldtty.c_cc[0x18] = local_48.c_cc[0x18];
    oldtty.c_cc[0x19] = local_48.c_cc[0x19];
    oldtty.c_cc[0x1a] = local_48.c_cc[0x1a];
    oldtty.c_cc[0x1b] = local_48.c_cc[0x1b];
    oldtty.c_cc[0x1c] = local_48.c_cc[0x1c];
    oldtty.c_cc[0x1d] = local_48.c_cc[0x1d];
    oldtty.c_cc[0x1e] = local_48.c_cc[0x1e];
    oldtty.c_cc[0x1f] = local_48.c_cc[0x1f];
    oldtty._49_3_ = local_48._49_3_;
    oldtty.c_ispeed = local_48.c_ispeed;
    oldtty.c_ospeed = local_48.c_ospeed;
    local_48._8_8_ = local_48._8_8_ & 0xffff7fb5fffffecf | 0x30;
    local_48.c_cc._5_2_ = 0x100;
    tcsetattr(local_4c,0,&local_48);
    atexit(term_exit);
    uVar3 = 3;
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar3;
  return (JSValue)(auVar1 << 0x40);
}

Assistant:

static JSValue js_os_ttySetRaw(JSContext *ctx, JSValueConst this_val,
                               int argc, JSValueConst *argv)
{
    struct termios tty;
    int fd;
    
    if (JS_ToInt32(ctx, &fd, argv[0]))
        return JS_EXCEPTION;
    
    memset(&tty, 0, sizeof(tty));
    tcgetattr(fd, &tty);
    oldtty = tty;

    tty.c_iflag &= ~(IGNBRK|BRKINT|PARMRK|ISTRIP
                          |INLCR|IGNCR|ICRNL|IXON);
    tty.c_oflag |= OPOST;
    tty.c_lflag &= ~(ECHO|ECHONL|ICANON|IEXTEN);
    tty.c_cflag &= ~(CSIZE|PARENB);
    tty.c_cflag |= CS8;
    tty.c_cc[VMIN] = 1;
    tty.c_cc[VTIME] = 0;

    tcsetattr(fd, TCSANOW, &tty);

    atexit(term_exit);
    return JS_UNDEFINED;
}